

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall
CS248::Application::draw_string(Application *this,float x,float y,string *str,size_t size,Color *c)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int line_index;
  int local_54;
  string local_50;
  
  uVar1 = this->screenW;
  uVar2 = this->screenH;
  std::__cxx11::string::string((string *)&local_50,(string *)str);
  iVar3 = OSDText::add_line(&this->textManager,(x + x) / (float)uVar1 + -1.0,
                            1.0 - (y + y) / (float)uVar2,&local_50,size,*c);
  std::__cxx11::string::~string((string *)&local_50);
  local_54 = iVar3;
  std::vector<int,_std::allocator<int>_>::push_back(&this->messages,&local_54);
  return;
}

Assistant:

inline void Application::draw_string(float x, float y, string str, size_t size,
                                     const Color &c) {
  int line_index = textManager.add_line((x * 2 / screenW) - 1.0,
                                        (-y * 2 / screenH) + 1.0, str, size, c);
  messages.push_back(line_index);
}